

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O3

bool __thiscall Js::SharedContents::IsValidAgent(SharedContents *this,DWORD_PTR agent)

{
  SharableAgents *pSVar1;
  DWORD_PTR *pDVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  CCLock::Enter(&(this->csAgent).super_CCLock);
  pSVar1 = this->allowedAgents;
  if ((pSVar1 == (SharableAgents *)0x0) ||
     (uVar4 = (ulong)(pSVar1->
                     super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
                     count, (long)uVar4 < 1)) {
    bVar6 = false;
  }
  else {
    pDVar2 = (pSVar1->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
             buffer;
    bVar6 = true;
    if (*pDVar2 != agent) {
      uVar3 = 1;
      do {
        uVar5 = uVar3;
        if (uVar4 == uVar5) break;
        uVar3 = uVar5 + 1;
      } while (pDVar2[uVar5] != agent);
      bVar6 = uVar5 < uVar4;
    }
  }
  CCLock::Leave(&(this->csAgent).super_CCLock);
  return bVar6;
}

Assistant:

bool SharedContents::IsValidAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        return allowedAgents != nullptr && allowedAgents->Contains(agent);
    }